

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv_async_send(uv_async_t *handle)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  size_t __n;
  char *__buf;
  
  if (handle->pending == 0) {
    LOCK();
    (handle->u).fd = (handle->u).fd + 1;
    UNLOCK();
    LOCK();
    iVar3 = handle->pending;
    handle->pending = 1;
    UNLOCK();
    if (iVar3 == 0) {
      iVar3 = handle->loop->async_wfd;
      if (iVar3 == -1) {
        iVar3 = (handle->loop->async_io_watcher).fd;
        __buf = "\x01";
        __n = 8;
      }
      else {
        __buf = "";
        __n = 1;
      }
      do {
        sVar1 = write(iVar3,__buf,__n);
        if ((int)sVar1 != -1) {
          if ((long)(int)sVar1 == __n) goto LAB_0015eef4;
          goto LAB_0015eee8;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      if (*piVar2 != 0xb) {
LAB_0015eee8:
        abort();
      }
    }
LAB_0015eef4:
    LOCK();
    (handle->u).fd = (handle->u).fd + -1;
    UNLOCK();
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  _Atomic int* pending;
  _Atomic int* busy;

  pending = (_Atomic int*) &handle->pending;
  busy = (_Atomic int*) &handle->u.fd;

  /* Do a cheap read first. */
  if (atomic_load_explicit(pending, memory_order_relaxed) != 0)
    return 0;

  /* Set the loop to busy. */
  atomic_fetch_add(busy, 1);

  /* Wake up the other thread's event loop. */
  if (atomic_exchange(pending, 1) == 0)
    uv__async_send(handle->loop);

  /* Set the loop to not-busy. */
  atomic_fetch_add(busy, -1);

  return 0;
}